

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-loadavg.c
# Opt level: O2

int run_test_get_loadavg(void)

{
  char *pcVar1;
  undefined8 uStack_30;
  double avg [3];
  
  avg[0] = -1.0;
  avg[1] = -1.0;
  avg[2] = -1.0;
  uv_loadavg(avg);
  if (avg[0] < 0.0) {
    pcVar1 = "avg[0] >= 0";
    uStack_30 = 0x1e;
  }
  else if (avg[1] < 0.0) {
    pcVar1 = "avg[1] >= 0";
    uStack_30 = 0x1f;
  }
  else {
    if (0.0 <= avg[2]) {
      return 0;
    }
    pcVar1 = "avg[2] >= 0";
    uStack_30 = 0x20;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-loadavg.c"
          ,uStack_30,pcVar1);
  abort();
}

Assistant:

TEST_IMPL(get_loadavg) {

  double avg[3] = {-1, -1, -1};
  uv_loadavg(avg);

  ASSERT(avg[0] >= 0);
  ASSERT(avg[1] >= 0);
  ASSERT(avg[2] >= 0);

  return 0;
}